

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O3

hs_database_t * ZiLoadDatabase(char *dbfile,bool has_header,ZiEncryptHdr *header_recver)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  void *pvVar8;
  ostream *poVar9;
  hs_database_t *db;
  ifstream is;
  char local_230 [520];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[ Info ] Loading database from file: ",0x25);
  if (dbfile == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a188);
  }
  else {
    sVar4 = strlen(dbfile);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dbfile,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::ifstream::ifstream(local_230);
  std::ifstream::open(local_230,(_Ios_Openmode)dbfile);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[ ERROR ]Open ",0xe);
    if (dbfile == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a288);
    }
    else {
      sVar4 = strlen(dbfile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,dbfile,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Failed",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  else {
    std::istream::seekg((long)local_230,_S_beg);
    lVar5 = std::istream::tellg();
    std::istream::seekg((long)local_230,_S_beg);
    if (has_header) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[ Info ] Deserialize: Extracting header...",0x2a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      puVar6 = (undefined8 *)operator_new__(0xc);
      std::istream::read(local_230,(long)puVar6);
      if (header_recver != (ZiEncryptHdr *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[ Info ] Deserialize: Writing Header...",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        *(undefined4 *)((long)&header_recver->btime + 3) = *(undefined4 *)((long)puVar6 + 7);
        uVar1 = *puVar6;
        header_recver->magic = (int)uVar1;
        header_recver->btime = (int)((ulong)uVar1 >> 0x20);
      }
      operator_delete__(puVar6);
      lVar7 = -0xc;
    }
    else {
      lVar7 = 0;
    }
    pvVar8 = operator_new__(lVar5 + lVar7);
    std::istream::read(local_230,(long)pvVar8);
    std::ifstream::close();
    iVar3 = hs_deserialize_database(pvVar8,lVar5 + lVar7);
    operator_delete__(pvVar8);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[ ERROR ] Deserialize Failed with: ",0x23);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
      std::endl<char,std::char_traits<char>>(poVar9);
      exit(-1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[ Info ] Deserialize database successfully",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  std::ifstream::~ifstream(local_230);
  return (hs_database_t *)0x0;
}

Assistant:

hs_database_t* ZiLoadDatabase(const char* dbfile, bool has_header,
    struct ZiEncryptHdr* header_recver)
{
    cout << "[ Info ] Loading database from file: " << dbfile << endl;

    std::ifstream is;
    is.open(dbfile, ios::in | ios::binary);
    if (!is.is_open())
    {
        cerr << "[ ERROR ]Open " << dbfile << " Failed" << endl;
        return nullptr;
    }
    // Get the file's size
    is.seekg(0, ios::end);
    size_t total_len = is.tellg();
    // back to beginning and ready to read.
    is.seekg(0, ios::beg);
    // if header exists, extrace it first if @p header_recver is not nullptr
    size_t hdr_len = 0;
    if (has_header)
    {
        cout << "[ Info ] Deserialize: Extracting header..." << endl;

        hdr_len = sizeof(struct ZiEncryptHdr); // TODO assign a magic number
        char* hdr_buffer = new char[hdr_len];
        is.read(hdr_buffer, hdr_len);
        if (header_recver) // maybe assert is better
        {
            cout << "[ Info ] Deserialize: Writing Header..." << endl;
            *header_recver = *(struct ZiEncryptHdr*) hdr_buffer;
        }
        delete[] hdr_buffer;
    }
    // now read the real db data.
    size_t db_size = total_len - hdr_len;
    char* bytes = nullptr;
    bytes = new char[db_size];
    is.read(bytes, db_size);
    is.close();

    hs_database_t* db = nullptr;
    hs_error_t err = hs_deserialize_database(bytes, db_size, &db);

    delete[] bytes;

    if (err != HS_SUCCESS)
    {
        cerr << "[ ERROR ] Deserialize Failed with: " << err << endl;
        exit(-1);
    }
    cout << "[ Info ] Deserialize database successfully" << endl;

    return db;
}